

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O0

LY_ERR lyd_new_ext_inner(lysc_ext_instance *ext,char *name,lyd_node **node)

{
  ly_ctx *ctx_00;
  lysc_node *schema_00;
  LY_ERR ret__;
  ly_ctx *ctx;
  lysc_node *schema;
  lyd_node *ret;
  lyd_node **node_local;
  char *name_local;
  lysc_ext_instance *ext_local;
  
  schema = (lysc_node *)0x0;
  ret = (lyd_node *)node;
  node_local = (lyd_node **)name;
  name_local = (char *)ext;
  if (ext == (lysc_ext_instance *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ext","lyd_new_ext_inner")
    ;
    ext_local._4_4_ = LY_EINVAL;
  }
  else {
    ctx_00 = ext->module->ctx;
    if (node == (lyd_node **)0x0) {
      ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","node","lyd_new_ext_inner");
      ext_local._4_4_ = LY_EINVAL;
    }
    else if (name == (char *)0x0) {
      ly_log(ctx_00,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name","lyd_new_ext_inner");
      ext_local._4_4_ = LY_EINVAL;
    }
    else {
      schema_00 = lysc_ext_find_node(ext,(lys_module *)0x0,name,0,0x701,0);
      if (schema_00 == (lysc_node *)0x0) {
        if (*(long *)(name_local + 8) == 0) {
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                 "Inner node (not a list)  \"%s\" not found in instance of extension %s.",node_local
                 ,**(undefined8 **)name_local);
        }
        else {
          ly_log(ctx_00,LY_LLERR,LY_EINVAL,
                 "Inner node (not a list) \"%s\" not found in instance \"%s\" of extension %s.",
                 node_local,*(undefined8 *)(name_local + 8),**(undefined8 **)name_local);
        }
        ext_local._4_4_ = LY_ENOTFOUND;
      }
      else {
        ext_local._4_4_ = lyd_create_inner(schema_00,(lyd_node **)&schema);
        if (ext_local._4_4_ == LY_SUCCESS) {
          *(lysc_node **)ret = schema;
          ext_local._4_4_ = LY_SUCCESS;
        }
      }
    }
  }
  return ext_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_ext_inner(const struct lysc_ext_instance *ext, const char *name, struct lyd_node **node)
{
    struct lyd_node *ret = NULL;
    const struct lysc_node *schema;
    struct ly_ctx *ctx = ext ? ext->module->ctx : NULL;

    LY_CHECK_ARG_RET(ctx, ext, node, name, LY_EINVAL);

    schema = lysc_ext_find_node(ext, NULL, name, 0, LYS_CONTAINER | LYS_NOTIF | LYS_RPC | LYS_ACTION, 0);
    if (!schema) {
        if (ext->argument) {
            LOGERR(ctx, LY_EINVAL, "Inner node (not a list) \"%s\" not found in instance \"%s\" of extension %s.",
                    name, ext->argument, ext->def->name);
        } else {
            LOGERR(ctx, LY_EINVAL, "Inner node (not a list)  \"%s\" not found in instance of extension %s.",
                    name, ext->def->name);
        }
        return LY_ENOTFOUND;
    }
    LY_CHECK_RET(lyd_create_inner(schema, &ret));

    *node = ret;

    return LY_SUCCESS;
}